

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O1

void __thiscall Painter::update(Painter *this)

{
  pointer psVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  Shape local_98;
  double local_48;
  double local_40;
  undefined8 local_38;
  
  uVar3 = (uint)((ulong)((long)(this->m_nodes->
                               super__Vector_base<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_nodes->
                              super__Vector_base<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)uVar3) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    lVar5 = 8;
    do {
      psVar1 = (this->m_nodes->
               super__Vector_base<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)((long)psVar1 + lVar5 + -8);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar1->super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar5);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_48 = *(double *)(lVar2 + 0xc0) * 0.1;
      local_40 = *(double *)(lVar2 + 200) * 0.1;
      uVar3 = *(uint *)(lVar2 + 0xf8);
      local_98.stroke.color.red = uVar3 >> 0x10 & 0xff;
      local_98.stroke.color.green = uVar3 >> 8 & 0xff;
      local_98.stroke.color.blue = uVar3 & 0xff;
      if (*(int *)(lVar2 + 0xd0) == 4) {
        local_98.fill.super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Fill_00116c50;
        local_98.fill.color.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Serializeable_00116c00;
        local_98.fill.color.transparent = false;
        local_98.fill.color.red = 0;
        local_98.fill.color.green = 0;
        local_98.fill.color.blue = 0;
        local_98.stroke.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Stroke_00116c90;
        local_98.stroke.width = 1.0;
        local_98.stroke.color.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Serializeable_00116c00;
        local_98.stroke.color.transparent = false;
        local_98.super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Shape_00116cd0;
        local_38 = 0x3ff0000000000000;
        svg::Document::operator<<(this->m_doc,&local_98);
      }
      else {
        local_98.fill.super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Fill_00116c50;
        local_98.fill.color.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Serializeable_00116c00;
        local_98.fill.color.transparent = false;
        local_98.fill.color._12_8_ = CONCAT44(uVar3 >> 8,uVar3 >> 0x10) & 0xff000000ff;
        local_98.stroke.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Stroke_00116c90;
        local_98.stroke.width = 1.0;
        local_98.stroke.color.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Serializeable_00116c00;
        local_98.stroke.color.transparent = false;
        local_98.super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Shape_00116cd0;
        local_38 = 0x3ff0000000000000;
        local_98.fill.color.blue = local_98.stroke.color.blue;
        svg::Document::operator<<(this->m_doc,&local_98);
      }
      svg::Document::save(this->m_doc);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      lVar5 = lVar5 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void Painter::update()
{
	int size = m_nodes.size();
	for(int i=0;i<size;i++)
	{
		std::shared_ptr<mmWaveBS> dd = m_nodes[i];
		double x = (0.1) * dd.get()->getX();
		double y = (0.1) * dd.get()->getY();
	
		std::size_t color = dd.get()->getColor();
		std::size_t red = (color & 0xff0000) >> 16; 
		std::size_t green =(color & 0x00ff00) >> 8; 
		std::size_t blue = (color & 0x0000ff);  	
// 		std::cout << "Status = " << dd.get()->getStatus() << std::endl;
		if(dd.get()->getStatus()==Status::clusterHead)
			*m_doc << Circle(Point(x, y), 2, Fill(Color(0,0,0)), Stroke(1, Color(red,green,blue)));
		else
			*m_doc << Circle(Point(x, y), 2, Fill(Color(red,green,blue)), Stroke(1, Color(red, green, blue)));
		
		m_doc->save();
	}
}